

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O3

uint8_t * bson_reserve_buffer(bson_t *bson,uint32_t size)

{
  _Bool _Var1;
  
  if (((bson->flags & 0x1c) == 0) && (_Var1 = _bson_grow(bson,size), _Var1)) {
    bson->len = size;
    if ((bson->flags & 1) == 0) {
      return (uint8_t *)(**(long **)(bson->padding + 0x10) + *(long *)(bson->padding + 0x20));
    }
    return bson->padding;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *
bson_reserve_buffer (bson_t *bson, uint32_t size)
{
   if (bson->flags &
       (BSON_FLAG_CHILD | BSON_FLAG_IN_CHILD | BSON_FLAG_RDONLY)) {
      return NULL;
   }

   if (!_bson_grow (bson, size)) {
      return NULL;
   }

   if (bson->flags & BSON_FLAG_INLINE) {
      /* bson_grow didn't spill over */
      ((bson_impl_inline_t *) bson)->len = size;
   } else {
      ((bson_impl_alloc_t *) bson)->len = size;
   }

   return _bson_data (bson);
}